

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tigervision.hpp
# Opt level: O2

void __thiscall
Atari2600::Cartridge::Tigervision::perform_bus_operation
          (Tigervision *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  if ((address & 0x1fff) == 0x3f) {
    this->rom_ptr_[0] =
         (this->super_BusExtender).rom_base_ +
         ((int)(this->super_BusExtender).rom_size_ - 1U & (uint)*value << 0xb);
  }
  else if ((int)operation < 5 && (address >> 0xc & 1) != 0) {
    *value = *(uint8_t *)
              (*(long *)((long)this->rom_ptr_ + (ulong)((byte)(address >> 8) & 8)) +
              (ulong)(address & 0x7ff));
    return;
  }
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			if((address&0x1fff) == 0x3f) {
				int offset = ((*value) * 2048) & (rom_size_ - 1);
				rom_ptr_[0] = rom_base_ + offset;
				return;
			} else if((address&0x1000) && isReadOperation(operation)) {
				*value = rom_ptr_[(address >> 11)&1][address & 2047];
			}
		}